

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

bool util::HasPrefix<prevector<16u,unsigned_char,unsigned_int,int>,12ul>
               (prevector<16U,_unsigned_char,_unsigned_int,_int> *obj,
               array<unsigned_char,_12UL> *prefix)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  long in_FS_OFFSET;
  
  uVar1 = obj->_size;
  uVar2 = uVar1 - 0x11;
  if (uVar1 < 0x11) {
    uVar2 = uVar1;
  }
  if (uVar2 < 0xc) {
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      return false;
    }
  }
  else {
    if (0x10 < uVar1) {
      obj = (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
            (obj->_union).indirect_contents.indirect;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
      bVar3 = std::__equal<false>::
              equal<unsigned_char_const*,prevector<16u,unsigned_char,unsigned_int,int>::const_iterator>
                        (prefix->_M_elems,prefix[1]._M_elems,(const_iterator)obj);
      return bVar3;
    }
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] inline bool HasPrefix(const T1& obj,
                                const std::array<uint8_t, PREFIX_LEN>& prefix)
{
    return obj.size() >= PREFIX_LEN &&
           std::equal(std::begin(prefix), std::end(prefix), std::begin(obj));
}